

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O1

void lqUpdateForNewLocation(lqInternalDB *lq,lqClientProxy *object,float x,float y,float z)

{
  lqClientProxy **pplVar1;
  
  pplVar1 = lqBinForLocation(lq,x,y,z);
  object->x = x;
  object->y = y;
  object->z = z;
  if (pplVar1 != object->bin) {
    lqRemoveFromBin(object);
    if (*pplVar1 == (lqClientProxy *)0x0) {
      object->prev = (lqClientProxy *)0x0;
      object->next = (lqClientProxy *)0x0;
    }
    else {
      object->prev = (lqClientProxy *)0x0;
      object->next = *pplVar1;
      (*pplVar1)->prev = object;
    }
    *pplVar1 = object;
    object->bin = pplVar1;
  }
  return;
}

Assistant:

void lqUpdateForNewLocation  (lqInternalDB* lq, 
			      lqClientProxy* object, 
			      float x, float y, float z)
{
    /* find bin for new location */
    lqClientProxy** newBin = lqBinForLocation (lq, x, y, z);

    /* store location in client object, for future reference */
    object->x = x;
    object->y = y;
    object->z = z;

    /* has object moved into a new bin? */
    if (newBin != object->bin)
    {
	lqRemoveFromBin (object);
 	lqAddToBin (object, newBin);
    }
}